

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O0

bool __thiscall
QStyledItemDelegate::editorEvent
          (QStyledItemDelegate *this,QEvent *event,QAbstractItemModel *model,
          QStyleOptionViewItem *option,QModelIndex *index)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  MouseButton MVar4;
  int iVar5;
  CheckState CVar6;
  Int IVar7;
  QWidget *pQVar8;
  QStyle *pQVar9;
  QStyleOptionViewItem *in_RCX;
  long *in_RDX;
  QEvent *in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  CheckState state;
  QMouseEvent *me;
  QStyle *style;
  QWidget *widget;
  QRect checkRect;
  ItemFlags flags;
  QStyleOptionViewItem viewOpt;
  QVariant value;
  undefined4 in_stack_fffffffffffffe28;
  ItemFlag in_stack_fffffffffffffe2c;
  QStyleOptionViewItem *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  uint uVar10;
  QModelIndex *in_stack_fffffffffffffe48;
  bool local_1a5;
  int local_1a4;
  byte local_155;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_154;
  QPointF local_150;
  QPoint local_140;
  undefined1 local_138 [16];
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_128;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_124;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_120;
  undefined4 local_11c;
  undefined1 local_118 [208];
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_11c = 0xaaaaaaaa;
  local_11c = (**(code **)(*in_RDX + 0x138))(in_RDX,in_R8);
  local_120.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)
       QFlags<Qt::ItemFlag>::operator&
                 ((QFlags<Qt::ItemFlag> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
  bVar1 = QFlags<Qt::ItemFlag>::operator!((QFlags<Qt::ItemFlag> *)&local_120);
  local_1a5 = true;
  if (!bVar1) {
    local_124.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorage<QStyle::StateFlag>)
         QFlags<QStyle::StateFlag>::operator&
                   ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c
                   );
    bVar1 = QFlags<QStyle::StateFlag>::operator!((QFlags<QStyle::StateFlag> *)&local_124);
    local_1a5 = true;
    if (!bVar1) {
      local_128.super_QFlagsStorage<Qt::ItemFlag>.i =
           (QFlagsStorage<Qt::ItemFlag>)
           QFlags<Qt::ItemFlag>::operator&
                     ((QFlags<Qt::ItemFlag> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      local_1a5 = QFlags<Qt::ItemFlag>::operator!((QFlags<Qt::ItemFlag> *)&local_128);
    }
  }
  if (local_1a5 != false) {
    local_155 = 0;
    goto LAB_008606a9;
  }
  local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
  bVar1 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffe30);
  if (bVar1) {
    pQVar8 = QStyledItemDelegatePrivate::widget(in_RCX);
    if (pQVar8 == (QWidget *)0x0) {
      pQVar9 = QApplication::style();
    }
    else {
      pQVar9 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    }
    TVar3 = QEvent::type(in_RSI);
    if (((TVar3 == MouseButtonRelease) ||
        (TVar3 = QEvent::type(in_RSI), TVar3 == MouseButtonDblClick)) ||
       (TVar3 = QEvent::type(in_RSI), TVar3 == MouseButtonPress)) {
      memset(local_118,0xaa,0xd0);
      QStyleOptionViewItem::QStyleOptionViewItem
                (in_stack_fffffffffffffe30,
                 (QStyleOptionViewItem *)
                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      (**(code **)(*in_RDI + 0xb8))(in_RDI,local_118,in_R8);
      local_138._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_138._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_138 = (**(code **)(*(long *)pQVar9 + 0xc0))(pQVar9,0x17,local_118,pQVar8);
      MVar4 = QSinglePointEvent::button((QSinglePointEvent *)in_RSI);
      uVar10 = CONCAT13(1,(int3)in_stack_fffffffffffffe44);
      if (MVar4 == LeftButton) {
        local_150 = QSinglePointEvent::position((QSinglePointEvent *)0x8604c1);
        local_140 = QPointF::toPoint((QPointF *)CONCAT44(uVar10,in_stack_fffffffffffffe40));
        bVar2 = QRect::contains((QPoint *)local_138,SUB81(&local_140,0));
        uVar10 = (uint)bVar2 << 0x18 ^ 0xff000000;
      }
      if ((uVar10 & 0x1000000) == 0) {
        TVar3 = QEvent::type(in_RSI);
        if (TVar3 != MouseButtonPress) {
          TVar3 = QEvent::type(in_RSI);
          if (TVar3 != MouseButtonDblClick) {
            bVar1 = false;
            goto LAB_00860559;
          }
        }
        local_155 = 1;
        bVar1 = true;
      }
      else {
        local_155 = 0;
        bVar1 = true;
      }
LAB_00860559:
      QStyleOptionViewItem::~QStyleOptionViewItem(in_stack_fffffffffffffe30);
      if (!bVar1) goto LAB_008605d3;
    }
    else {
      TVar3 = QEvent::type(in_RSI);
      if (TVar3 == KeyPress) {
        iVar5 = QKeyEvent::key((QKeyEvent *)in_RSI);
        if (iVar5 != 0x20) {
          iVar5 = QKeyEvent::key((QKeyEvent *)in_RSI);
          if (iVar5 != 0x1010000) {
            local_155 = 0;
            goto LAB_0086069c;
          }
        }
LAB_008605d3:
        CVar6 = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>
                          ((QVariant *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
                          );
        local_154.super_QFlagsStorage<Qt::ItemFlag>.i =
             (QFlagsStorage<Qt::ItemFlag>)
             QFlags<Qt::ItemFlag>::operator&
                       ((QFlags<Qt::ItemFlag> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c)
        ;
        IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_154);
        if (IVar7 == 0) {
          local_1a4 = 2;
          if (CVar6 == Checked) {
            local_1a4 = 0;
          }
        }
        else {
          local_1a4 = (int)(CVar6 + PartiallyChecked) % 3;
        }
        ::QVariant::QVariant(&local_48,local_1a4);
        bVar2 = (**(code **)(*in_RDX + 0x98))(in_RDX,in_R8,&local_48,10);
        local_155 = bVar2 & 1;
        ::QVariant::~QVariant(&local_48);
      }
      else {
        local_155 = 0;
      }
    }
  }
  else {
    local_155 = 0;
  }
LAB_0086069c:
  ::QVariant::~QVariant((QVariant *)&local_28);
LAB_008606a9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_155 & 1);
}

Assistant:

bool QStyledItemDelegate::editorEvent(QEvent *event,
                                QAbstractItemModel *model,
                                const QStyleOptionViewItem &option,
                                const QModelIndex &index)
{
    Q_ASSERT(event);
    Q_ASSERT(model);

    // make sure that the item is checkable
    Qt::ItemFlags flags = model->flags(index);
    if (!(flags & Qt::ItemIsUserCheckable) || !(option.state & QStyle::State_Enabled)
        || !(flags & Qt::ItemIsEnabled))
        return false;

    // make sure that we have a check state
    QVariant value = index.data(Qt::CheckStateRole);
    if (!value.isValid())
        return false;

    const QWidget *widget = QStyledItemDelegatePrivate::widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();

    // make sure that we have the right event type
    if ((event->type() == QEvent::MouseButtonRelease)
        || (event->type() == QEvent::MouseButtonDblClick)
        || (event->type() == QEvent::MouseButtonPress)) {
        QStyleOptionViewItem viewOpt(option);
        initStyleOption(&viewOpt, index);
        QRect checkRect = style->subElementRect(QStyle::SE_ItemViewItemCheckIndicator, &viewOpt, widget);
        QMouseEvent *me = static_cast<QMouseEvent*>(event);
        if (me->button() != Qt::LeftButton || !checkRect.contains(me->position().toPoint()))
            return false;

        if ((event->type() == QEvent::MouseButtonPress)
            || (event->type() == QEvent::MouseButtonDblClick))
            return true;

    } else if (event->type() == QEvent::KeyPress) {
        if (static_cast<QKeyEvent*>(event)->key() != Qt::Key_Space
         && static_cast<QKeyEvent*>(event)->key() != Qt::Key_Select)
            return false;
    } else {
        return false;
    }

    Qt::CheckState state = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>(value);
    if (flags & Qt::ItemIsUserTristate)
        state = ((Qt::CheckState)((state + 1) % 3));
    else
        state = (state == Qt::Checked) ? Qt::Unchecked : Qt::Checked;
    return model->setData(index, state, Qt::CheckStateRole);
}